

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

string * __thiscall
foxxll::disk_config::fileio_string_abi_cxx11_(string *__return_storage_ptr__,disk_config *this)

{
  direct_type dVar1;
  ostream *poVar2;
  runtime_error *this_00;
  char *pcVar3;
  string local_330 [32];
  ostringstream oss;
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,(string *)&this->io_impl);
  if (this->autogrow == false) {
    std::operator<<((ostream *)&oss," autogrow=no");
  }
  if (this->delete_on_exit == true) {
    std::operator<<((ostream *)&oss," delete_on_exit");
  }
  dVar1 = this->direct;
  if (dVar1 == DIRECT_OFF) {
    pcVar3 = " direct=off";
  }
  else {
    if (dVar1 == DIRECT_TRY) goto LAB_0014609a;
    if (dVar1 != DIRECT_ON) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar2 = std::operator<<((ostream *)&msg,"Error in ");
      poVar2 = std::operator<<(poVar2,"std::string foxxll::disk_config::fileio_string() const");
      poVar2 = std::operator<<(poVar2," : ");
      std::operator<<(poVar2,"Invalid setting for \'direct\' option.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_330);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = " direct=on";
  }
  std::operator<<((ostream *)&oss,pcVar3);
LAB_0014609a:
  if (this->flash == true) {
    std::operator<<((ostream *)&oss," flash");
  }
  if ((uint)this->queue < 0xfffffffe) {
    poVar2 = std::operator<<((ostream *)&oss," queue=");
    std::ostream::operator<<(poVar2,this->queue);
  }
  if (this->device_id != 0xffffffff) {
    poVar2 = std::operator<<((ostream *)&oss," devid=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  if (this->raw_device == true) {
    std::operator<<((ostream *)&oss," raw_device");
  }
  if (this->unlink_on_open == true) {
    std::operator<<((ostream *)&oss," unlink_on_open");
  }
  if (this->queue_length != 0) {
    poVar2 = std::operator<<((ostream *)&oss," queue_length=");
    std::ostream::operator<<(poVar2,this->queue_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string disk_config::fileio_string() const
{
    std::ostringstream oss;

    oss << io_impl;

    if (!autogrow)
        oss << " autogrow=no";

    if (delete_on_exit)
        oss << " delete_on_exit";

    // tristate direct variable: OFF, TRY, ON
    if (direct == DIRECT_OFF)
    {
        oss << " direct=off";
    }
    else if (direct == DIRECT_TRY)
    { } // silenced: oss << " direct=try";
    else if (direct == DIRECT_ON)
    {
        oss << " direct=on";
    }
    else
        FOXXLL_THROW(std::runtime_error, "Invalid setting for 'direct' option.");

    if (flash) {
        oss << " flash";
    }

    if (queue != file::DEFAULT_QUEUE && queue != file::DEFAULT_LINUXAIO_QUEUE) {
        oss << " queue=" << queue;
    }

    if (device_id != file::DEFAULT_DEVICE_ID) {
        oss << " devid=" << device_id;
    }

    if (raw_device) {
        oss << " raw_device";
    }

    if (unlink_on_open) {
        oss << " unlink_on_open";
    }

    if (queue_length != 0) {
        oss << " queue_length=" << queue_length;
    }

    return oss.str();
}